

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O0

Validity * __thiscall
capnp::compiler::CompilerMain::setSegmentSize
          (Validity *__return_storage_ptr__,CompilerMain *this,StringPtr size)

{
  char *__nptr;
  long lVar1;
  size_t sVar2;
  char *local_30;
  char *end;
  CompilerMain *this_local;
  StringPtr size_local;
  
  size_local.content.ptr = (char *)size.content.size_;
  this_local = (CompilerMain *)size.content.ptr;
  end = (char *)this;
  size_local.content.size_ = (size_t)__return_storage_ptr__;
  if ((this->flat & 1U) == 0) {
    __nptr = kj::StringPtr::cStr((StringPtr *)&this_local);
    lVar1 = strtol(__nptr,&local_30,0);
    this->segmentSize = (uint)lVar1;
    sVar2 = kj::StringPtr::size((StringPtr *)&this_local);
    if ((sVar2 == 0) || (*local_30 != '\0')) {
      kj::MainBuilder::Validity::Validity(__return_storage_ptr__,"not an integer");
    }
    else {
      kj::MainBuilder::Validity::Validity(__return_storage_ptr__,true);
    }
  }
  else {
    kj::MainBuilder::Validity::Validity(__return_storage_ptr__,"cannot be used with --flat");
  }
  return __return_storage_ptr__;
}

Assistant:

kj::MainBuilder::Validity setSegmentSize(kj::StringPtr size) {
    if (flat) return "cannot be used with --flat";
    char* end;
    segmentSize = strtol(size.cStr(), &end, 0);
    if (size.size() == 0 || *end != '\0') {
      return "not an integer";
    }
    return true;
  }